

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_addcmpt(jas_image_t *image,int cmptno,jas_image_cmptparm_t *cmptparm)

{
  int iVar1;
  jas_image_cmpt_t *pjVar2;
  jas_image_cmpt_t *newcmpt;
  jas_image_cmptparm_t *cmptparm_local;
  int cmptno_local;
  jas_image_t *image_local;
  
  cmptparm_local._4_4_ = cmptno;
  if (cmptno < 0) {
    cmptparm_local._4_4_ = image->numcmpts_;
  }
  if ((-1 < (int)cmptparm_local._4_4_) && (cmptparm_local._4_4_ <= image->numcmpts_)) {
    if ((image->numcmpts_ < image->maxcmpts_) ||
       (iVar1 = jas_image_growcmpts(image,image->maxcmpts_ + 0x80), iVar1 == 0)) {
      pjVar2 = jas_image_cmpt_create
                         (cmptparm->tlx,cmptparm->tly,cmptparm->hstep,cmptparm->vstep,
                          cmptparm->width,cmptparm->height,(long)cmptparm->prec,cmptparm->sgnd != 0,
                          true);
      if (pjVar2 == (jas_image_cmpt_t *)0x0) {
        image_local._4_4_ = -1;
      }
      else {
        if (cmptparm_local._4_4_ < image->numcmpts_) {
          memmove(image->cmpts_ + (int)(cmptparm_local._4_4_ + 1),
                  image->cmpts_ + (int)cmptparm_local._4_4_,
                  (ulong)(image->numcmpts_ - cmptparm_local._4_4_) << 3);
        }
        image->cmpts_[(int)cmptparm_local._4_4_] = pjVar2;
        image->numcmpts_ = image->numcmpts_ + 1;
        jas_image_setbbox(image);
        image_local._4_4_ = 0;
      }
    }
    else {
      image_local._4_4_ = -1;
    }
    return image_local._4_4_;
  }
  __assert_fail("cmptno >= 0 && (unsigned)cmptno <= image->numcmpts_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_image.c"
                ,0x2fb,"int jas_image_addcmpt(jas_image_t *, int, const jas_image_cmptparm_t *)");
}

Assistant:

int jas_image_addcmpt(jas_image_t *image, int cmptno,
  const jas_image_cmptparm_t *cmptparm)
{
	jas_image_cmpt_t *newcmpt;
	if (cmptno < 0) {
		cmptno = image->numcmpts_;
	}
	assert(cmptno >= 0 && (unsigned)cmptno <= image->numcmpts_);
	if (image->numcmpts_ >= image->maxcmpts_) {
		if (jas_image_growcmpts(image, image->maxcmpts_ + 128)) {
			return -1;
		}
	}
	if (!(newcmpt = jas_image_cmpt_create(cmptparm->tlx,
	  cmptparm->tly, cmptparm->hstep, cmptparm->vstep,
	  cmptparm->width, cmptparm->height, cmptparm->prec,
	  cmptparm->sgnd, true))) {
		return -1;
	}
	if ((unsigned)cmptno < image->numcmpts_) {
		memmove(&image->cmpts_[cmptno + 1], &image->cmpts_[cmptno],
		  (image->numcmpts_ - (unsigned)cmptno) * sizeof(jas_image_cmpt_t *));
	}
	image->cmpts_[cmptno] = newcmpt;
	++image->numcmpts_;

	jas_image_setbbox(image);

	return 0;
}